

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseExpectedNan(WastParser *this,ExpectedNan *expected)

{
  Token local_68;
  TokenType local_24;
  ExpectedNan *pEStack_20;
  TokenType token_type;
  ExpectedNan *expected_local;
  WastParser *this_local;
  
  pEStack_20 = expected;
  expected_local = (ExpectedNan *)this;
  local_24 = Peek(this,0);
  if (local_24 == NanArithmetic) {
    *pEStack_20 = Arithmetic;
  }
  else {
    if (local_24 != NanCanonical) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    *pEStack_20 = Canonical;
  }
  Consume(&local_68,this);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseExpectedNan(ExpectedNan* expected) {
  WABT_TRACE(ParseExpectedNan);
  TokenType token_type = Peek();
  switch (token_type) {
    case TokenType::NanArithmetic:
      *expected = ExpectedNan::Arithmetic;
      break;
    case TokenType::NanCanonical:
      *expected = ExpectedNan::Canonical;
      break;
    default:
      return Result::Error;
  }
  Consume();
  return Result::Ok;
}